

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_sampler(Context *ctx,int stage,TextureType ttype,int tb)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char regnum_str [16];
  char var [64];
  char acStack_88 [16];
  char local_78 [72];
  
  if (tb != 0) {
    iVar1 = ctx->uniform_bool_count;
    iVar3 = ctx->uniform_int4_count + ctx->uniform_float4_count;
    snprintf(acStack_88,0x10,"%u",stage);
    snprintf(local_78,0x40,"%s%s","s",acStack_88);
    push_output(ctx,&ctx->globals);
    output_line(ctx,"PARAM %s_texbem = program.local[%d];",local_78,(ulong)(uint)(iVar3 + iVar1));
    output_line(ctx,"PARAM %s_texbeml = program.local[%d];",local_78,(ulong)(iVar3 + iVar1 + 1));
    if (ctx->output_stack_len < 1) {
      __assert_fail("ctx->output_stack_len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x173,"void pop_output(Context *)");
    }
    uVar2 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar2;
    ctx->output = ctx->output_stack[uVar2];
    ctx->indent = ctx->indent_stack[uVar2];
    ctx->uniform_float4_count = ctx->uniform_float4_count + 2;
  }
  return;
}

Assistant:

static void emit_ARB1_sampler(Context *ctx,int stage,TextureType ttype,int tb)
{
    // this is mostly a no-op...you don't predeclare samplers in arb1.

    if (tb)  // This sampler used a ps_1_1 TEXBEM opcode?
    {
        const int index = ctx->uniform_float4_count + ctx->uniform_int4_count +
                          ctx->uniform_bool_count;
        char var[64];
        get_ARB1_varname_in_buf(ctx, REG_TYPE_SAMPLER, stage, var, sizeof(var));
        push_output(ctx, &ctx->globals);
        output_line(ctx, "PARAM %s_texbem = program.local[%d];", var, index);
        output_line(ctx, "PARAM %s_texbeml = program.local[%d];", var, index+1);
        pop_output(ctx);
        ctx->uniform_float4_count += 2;
    } // if
}